

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

void __thiscall TimerManager::removeTimedEvent(TimerManager *this,Event *ev)

{
  uint uVar1;
  Timer **ppTVar2;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  AutoLock l;
  Event *ev_local;
  TimerManager *this_local;
  
  l._16_8_ = ev;
  AutoLock::AutoLock((AutoLock *)local_30,&this->mMutex);
  local_34 = 0;
  while( true ) {
    uVar1 = JetHead::vector<Timer_*>::size(&this->mTimers);
    if (uVar1 <= local_34) break;
    ppTVar2 = JetHead::vector<Timer_*>::operator[](&this->mTimers,local_34);
    Timer::removeTimedEvent(*ppTVar2,(Event *)l._16_8_);
    local_34 = local_34 + 1;
  }
  AutoLock::~AutoLock((AutoLock *)local_30);
  return;
}

Assistant:

void TimerManager::removeTimedEvent( Event *ev )
{
	TRACE_BEGIN(LOG_LVL_NOISE);

	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		mTimers[i]->removeTimedEvent(ev);
	}
	
}